

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::OpenPopupOnItemClick(char *str_id,ImGuiPopupFlags popup_flags)

{
  ImGuiWindow *this;
  ImGuiContext *pIVar1;
  bool bVar2;
  ImGuiID id;
  
  pIVar1 = GImGui;
  this = GImGui->CurrentWindow;
  bVar2 = IsMouseReleased(popup_flags & 0x1f);
  if (bVar2) {
    bVar2 = IsItemHovered(0x20);
    if (bVar2) {
      if (str_id == (char *)0x0) {
        id = (pIVar1->LastItemData).ID;
      }
      else {
        id = ImGuiWindow::GetID(this,str_id,(char *)0x0);
      }
      OpenPopupEx(id,popup_flags);
      return;
    }
  }
  return;
}

Assistant:

void ImGui::OpenPopupOnItemClick(const char* str_id, ImGuiPopupFlags popup_flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    int mouse_button = (popup_flags & ImGuiPopupFlags_MouseButtonMask_);
    if (IsMouseReleased(mouse_button) && IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByPopup))
    {
        ImGuiID id = str_id ? window->GetID(str_id) : g.LastItemData.ID;    // If user hasn't passed an ID, we can use the LastItemID. Using LastItemID as a Popup ID won't conflict!
        IM_ASSERT(id != 0);                                             // You cannot pass a NULL str_id if the last item has no identifier (e.g. a Text() item)
        OpenPopupEx(id, popup_flags);
    }
}